

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vminitim.cpp
# Opt level: O0

void vm_init_in_mem(vm_globals **vmg,vm_init_options *opts)

{
  vm_globals *vmg__;
  vm_init_options *in_stack_000011f8;
  vm_globals **in_stack_00001200;
  
  vm_init_base(in_stack_00001200,in_stack_000011f8);
  return;
}

Assistant:

void vm_init_in_mem(vm_globals **vmg, const vm_init_options *opts)
{
    /* initialize the base VM structures */
    vm_init_base(vmg, opts);

    /* 
     *   assign the global pointer to the special vmg__ local for
     *   globals-on-stack configuration 
     */
    vm_globals *vmg__ = *vmg;

    /* 
     *   explicitly mark vmg__ as reference, in case we don't happen to use
     *   it in this build configuration 
     */
    (void)vmg__;

    /* create the in-memory pools */
    VM_IF_ALLOC_PRE_GLOBAL(G_code_pool = new CVmPoolInMem());
    VM_IF_ALLOC_PRE_GLOBAL(G_const_pool = new CVmPoolInMem());
}